

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationMatrix<-1,_-1,_int>::operator=
          (PermutationMatrix<_1,__1,_int> *this,PermutationMatrix<_1,__1,_int> *other)

{
  Matrix<int,__1,_1,_0,__1,_1> *in_RSI;
  PermutationMatrix<_1,__1,_int> *in_RDI;
  
  Matrix<int,_-1,_1,_0,_-1,_1>::operator=(in_RSI,&in_RDI->m_indices);
  return in_RDI;
}

Assistant:

PermutationMatrix& operator=(const PermutationMatrix& other)
    {
      m_indices = other.m_indices;
      return *this;
    }